

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

int xmlVRaiseError(xmlStructuredErrorFunc schannel,xmlGenericErrorFunc channel,void *data,void *ctx,
                  xmlNode *node,int domain,int code,xmlErrorLevel level,char *file,int line,
                  char *str1,char *str2,char *str3,int int1,int col,char *msg,__va_list_tag *ap)

{
  ushort uVar1;
  xmlStructuredErrorFunc p_Var2;
  xmlGenericErrorFunc channel_00;
  xmlError *to;
  int *piVar3;
  long lVar4;
  xmlStructuredErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlGenericErrorFunc *pp_Var7;
  int iVar8;
  void *ctxt;
  int iVar9;
  xmlNode *node_00;
  xmlError *err;
  
  to = xmlGetLastErrorInternal();
  if (code == 0) {
    return 0;
  }
  piVar3 = __xmlGetWarningsDefaultValue();
  if ((level == XML_ERR_WARNING) && (*piVar3 == 0)) {
    return 0;
  }
  ctxt = (void *)0x0;
  err = to;
  if ((((uint)domain < 0x18) && ((0x80013aU >> (domain & 0x1fU) & 1) != 0)) &&
     (ctxt = ctx, err = (xmlError *)((long)ctx + 600), ctx == (void *)0x0)) {
    err = to;
  }
  if (node == (xmlNode *)0x0) {
    node_00 = (xmlNodePtr)0x0;
  }
  else {
    iVar8 = 0xb;
    do {
      node_00 = node;
      iVar8 = iVar8 + -1;
      if ((iVar8 == 0) || (node_00->type == XML_ELEMENT_NODE)) break;
      node = node_00->parent;
    } while (node_00->parent != (_xmlNode *)0x0);
    if (file == (char *)0x0) {
      if (node_00->doc == (_xmlDoc *)0x0) {
        file = (char *)0x0;
      }
      else {
        file = (char *)node_00->doc->URL;
      }
    }
    if (line == 0) {
      if (node_00->type == XML_ELEMENT_NODE) {
        uVar1 = node_00->line;
        line = (int)uVar1;
        if ((uVar1 != 0xffff) && (uVar1 != 0)) goto LAB_0012f751;
      }
      lVar4 = xmlGetLineNo(node_00);
      line = (int)lVar4;
    }
  }
LAB_0012f751:
  iVar8 = xmlVSetError(err,ctxt,node_00,domain,code,level,file,line,str1,str2,str3,int1,col,msg,ap);
  iVar9 = -1;
  if ((iVar8 == 0) && ((err == to || (iVar8 = xmlCopyError(err,to), -1 < iVar8)))) {
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      pp_Var5 = __xmlStructuredError();
      if (*pp_Var5 == (xmlStructuredErrorFunc)0x0) {
        if (channel == (xmlGenericErrorFunc)0x0) {
          return 0;
        }
        if ((((channel != xmlParserValidityWarning) && (channel != xmlParserValidityError)) &&
            (channel != xmlParserWarning)) &&
           ((channel != xmlGenericErrorDefaultFunc && (channel != xmlParserError)))) {
          (*channel)(data,"%s",err->message);
          return 0;
        }
        pp_Var7 = __xmlGenericError();
        channel_00 = *pp_Var7;
        ppvVar6 = __xmlGenericErrorContext();
        xmlFormatError(err,channel_00,*ppvVar6);
        return 0;
      }
      pp_Var5 = __xmlStructuredError();
      p_Var2 = *pp_Var5;
      ppvVar6 = __xmlStructuredErrorContext();
      (*p_Var2)(*ppvVar6,err);
    }
    else {
      (*schannel)(data,err);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int
xmlVRaiseError(xmlStructuredErrorFunc schannel,
               xmlGenericErrorFunc channel, void *data, void *ctx,
               xmlNode *node, int domain, int code, xmlErrorLevel level,
               const char *file, int line, const char *str1,
               const char *str2, const char *str3, int int1, int col,
               const char *msg, va_list ap)
{
    xmlParserCtxtPtr ctxt = NULL;
    /* xmlLastError is a macro retrieving the per-thread global. */
    xmlErrorPtr lastError = xmlGetLastErrorInternal();
    xmlErrorPtr to = lastError;

    if (code == XML_ERR_OK)
        return(0);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (code == XML_ERR_INTERNAL_ERROR)
        xmlAbort("Unexpected error: %d\n", code);
#endif
    if ((xmlGetWarningsDefaultValue == 0) && (level == XML_ERR_WARNING))
        return(0);

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = (xmlParserCtxtPtr) ctx;

        if (ctxt != NULL)
            to = &ctxt->lastError;
    }

    if (xmlVUpdateError(to, ctxt, node, domain, code, level, file, line,
                        str1, str2, str3, int1, col, msg, ap))
        return(-1);

    if (to != lastError) {
        if (xmlCopyError(to, lastError) < 0)
            return(-1);
    }

    if (schannel != NULL) {
	schannel(data, to);
    } else if (xmlStructuredError != NULL) {
        xmlStructuredError(xmlStructuredErrorContext, to);
    } else if (channel != NULL) {
        /* Don't invoke legacy error handlers */
        if ((channel == xmlGenericErrorDefaultFunc) ||
            (channel == xmlParserError) ||
            (channel == xmlParserWarning) ||
            (channel == xmlParserValidityError) ||
            (channel == xmlParserValidityWarning))
            xmlFormatError(to, xmlGenericError, xmlGenericErrorContext);
        else
	    channel(data, "%s", to->message);
    }

    return(0);
}